

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

string * anon_unknown.dwarf_43fe4::getFuncName
                   (string *__return_storage_ptr__,string *name,size_t numArgs)

{
  ostream *poVar1;
  size_t i;
  size_t sVar2;
  stringstream stream;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  poVar1 = std::operator<<(local_1a8,(string *)name);
  std::operator<<(poVar1,"(");
  for (sVar2 = 0; numArgs != sVar2; sVar2 = sVar2 + 1) {
    if (sVar2 != 0) {
      std::operator<<(local_1a8,", ");
    }
    poVar1 = std::operator<<(local_1a8,"x");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::operator<<(local_1a8,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string getFuncName(std::string name, std::size_t numArgs) {
		std::stringstream stream;

		stream << name << "(";
		for (std::size_t i = 0; i < numArgs; i++) {
			if (i != 0) {
				stream << ", ";
			}

			stream << "x" << i;
		}

		stream << ")";

		return stream.str();
	}